

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

Promise<void> __thiscall
kj::TlsConnection::writeInternal
          (TlsConnection *this,ArrayPtr<const_unsigned_char> first,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> rest)

{
  char cVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  None *pNVar3;
  Exception *func;
  size_t *psVar4;
  long in_R9;
  bool bVar5;
  undefined1 auStack_78 [8];
  DebugComparison<kj::Maybe<kj::Promise<void>_>_&,_const_kj::None_&> _kjCondition;
  Fault f;
  
  psVar4 = (size_t *)rest.size_;
  pAVar2 = rest.ptr;
  pNVar3 = (None *)first.size_;
  func = (Exception *)first.ptr;
  _kjCondition.left = (Maybe<kj::Promise<void>_> *)&(func->description).content.size_;
  cVar1 = (char)(func->description).content.size_;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition._32_8_ = CONCAT71(_kjCondition._33_7_,cVar1) ^ 1;
  if (cVar1 != '\0') {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Promise<void>>&,kj::None_const&>&,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
               ,0x16d,FAILED,"shutdownTask == kj::none",
               "_kjCondition,\"already called shutdownWrite()\"",&_kjCondition,
               (char (*) [31])"already called shutdownWrite()");
    kj::_::Debug::Fault::fatal(&f);
  }
  while( true ) {
    if (pAVar2 != (ArrayPtr<const_unsigned_char> *)0x0) {
      f.exception = func;
      sslCall<kj::TlsConnection::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
                ((TlsConnection *)auStack_78,(anon_class_24_2_f7c8139d *)func);
      _kjCondition.left = (Maybe<kj::Promise<void>_> *)func;
      _kjCondition.right = pNVar3;
      _kjCondition.op.content.ptr = (char *)pAVar2;
      _kjCondition.op.content.size_ = (size_t)psVar4;
      _kjCondition._32_8_ = in_R9;
      Promise<unsigned_long>::
      then<kj::TlsConnection::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda(unsigned_long)_1_>
                ((Promise<unsigned_long> *)this,(anon_class_40_3_cd5868ef_for_func *)auStack_78);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)auStack_78);
      return (PromiseBase)(PromiseBase)this;
    }
    bVar5 = in_R9 == 0;
    in_R9 = in_R9 + -1;
    if (bVar5) break;
    pNVar3 = (None *)*psVar4;
    pAVar2 = (ArrayPtr<const_unsigned_char> *)psVar4[1];
    psVar4 = psVar4 + 2;
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeInternal(kj::ArrayPtr<const byte> first,
                              kj::ArrayPtr<const kj::ArrayPtr<const byte>> rest) {
    KJ_REQUIRE(shutdownTask == kj::none, "already called shutdownWrite()");

    // SSL_write() with a zero-sized input returns 0, but a 0 return is documented as indicating
    // an error. So, we need to avoid zero-sized writes entirely.
    while (first.size() == 0) {
      if (rest.size() == 0) {
        return kj::READY_NOW;
      }
      first = rest.front();
      rest = rest.slice(1, rest.size());
    }

    return sslCall([this,first]() { return SSL_write(ssl, first.begin(), first.size()); })
        .then([this,first,rest](size_t n) -> kj::Promise<void> {
      if (n == 0) {
        return KJ_EXCEPTION(DISCONNECTED, "ssl connection ended during write");
      } else if (n < first.size()) {
        return writeInternal(first.slice(n, first.size()), rest);
      } else if (rest.size() > 0) {
        return writeInternal(rest[0], rest.slice(1, rest.size()));
      } else {
        return kj::READY_NOW;
      }
    });
  }